

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::
PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
::~PolymorphicMatcher
          (PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
           *this)

{
  PolymorphicMatcher<testing::internal::PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>_>
  *this_local;
  
  internal::
  PropertyMatcher<google::protobuf::FieldDescriptor,_int,_int_(google::protobuf::FieldDescriptor::*)()_const>
  ::~PropertyMatcher(&this->impl_);
  return;
}

Assistant:

explicit PolymorphicMatcher(const Impl& an_impl) : impl_(an_impl) {}